

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::TransRangeSyntax::TransRangeSyntax
          (TransRangeSyntax *this,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *items,
          TransRepeatRangeSyntax *repeat)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  ExpressionSyntax *pEVar4;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::ExpressionSyntax_*> local_30;
  
  (this->super_SyntaxNode).kind = TransRange;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  uVar3 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00679298;
  sVar1 = (items->elements)._M_extent._M_extent_value;
  (this->items).elements._M_ptr = (items->elements)._M_ptr;
  (this->items).elements._M_extent._M_extent_value = sVar1;
  this->repeat = repeat;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->items).elements._M_extent._M_extent_value;
  local_30.list = &this->items;
  for (; (local_30.list != &this->items || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::dereference(&local_30);
    (pEVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  if (this->repeat != (TransRepeatRangeSyntax *)0x0) {
    (this->repeat->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

TransRangeSyntax(const SeparatedSyntaxList<ExpressionSyntax>& items, TransRepeatRangeSyntax* repeat) :
        SyntaxNode(SyntaxKind::TransRange), items(items), repeat(repeat) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->repeat) this->repeat->parent = this;
    }